

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Show(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  char *pcVar3;
  uint fPath;
  Gia_Man_t *pMan;
  uint fAdders;
  char *pcVar4;
  uint local_3c;
  Vec_Int_t *vBold;
  
  vBold = (Vec_Int_t *)0x0;
  fAdders = 0;
  Extra_UtilGetoptReset();
  local_3c = 0;
  fPath = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"afph"), iVar1 == 0x70) {
      fPath = fPath ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x66) {
      local_3c = local_3c ^ 1;
    }
    else {
      if (iVar1 != 0x61) {
        iVar1 = -2;
        Abc_Print(-2,"usage: &show [-afph]\n");
        Abc_Print(-2,"\t        shows the current GIA using GSView\n");
        pcVar4 = "yes";
        pcVar3 = "yes";
        if (fAdders == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-a    : toggle visualazing adders [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (local_3c == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-f    : toggle showing only full-adders with \"-a\" [default = %s]\n",pcVar3
                 );
        if (fPath == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-p    : toggle showing the critical path of a LUT mapping [default = %s]\n",
                  pcVar4);
        pcVar3 = "\t-h    : print the command usage\n";
LAB_002472b6:
        Abc_Print(iVar1,pcVar3);
        return 1;
      }
      fAdders = fAdders ^ 1;
    }
  }
  pMan = pAbc->pGia;
  if (pMan == (Gia_Man_t *)0x0) {
    pcVar3 = "Abc_CommandAbc9Show(): There is no AIG.\n";
  }
  else {
    if (pMan->nBufs == 0) {
      if ((fAdders == 0) && (pMan->vMapping != (Vec_Int_t *)0x0)) {
        p = Vec_IntAlloc(100);
        vBold = p;
        for (iVar1 = 1; pMan = pAbc->pGia, iVar1 < pMan->nObjs; iVar1 = iVar1 + 1) {
          iVar2 = Vec_IntEntry(pMan->vMapping,iVar1);
          if (iVar2 != 0) {
            Vec_IntPush(p,iVar1);
          }
        }
      }
      else {
        p = (Vec_Int_t *)0x0;
      }
      Gia_ManShow(pMan,p,fAdders,local_3c,fPath);
      Vec_IntFreeP(&vBold);
      return 0;
    }
    pcVar3 = "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n";
  }
  iVar1 = -1;
  goto LAB_002472b6;
}

Assistant:

int Abc_CommandAbc9Show( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Int_t * vBold = NULL;
    int c, fAdders = 0, fFadds = 0, fPath = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "afph" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAdders ^= 1;
            break;
        case 'f':
            fFadds ^= 1;
            break;
        case 'p':
            fPath ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n" );
        return 1;
    }
    if ( !fAdders && Gia_ManHasMapping(pAbc->pGia) )
    {
        vBold = Vec_IntAlloc( 100 );
        Gia_ManForEachLut( pAbc->pGia, c )
            Vec_IntPush( vBold, c );
    }
    Gia_ManShow( pAbc->pGia, vBold, fAdders, fFadds, fPath );
    Vec_IntFreeP( &vBold );
    return 0;

usage:
    Abc_Print( -2, "usage: &show [-afph]\n" );
    Abc_Print( -2, "\t        shows the current GIA using GSView\n" );
    Abc_Print( -2, "\t-a    : toggle visualazing adders [default = %s]\n", fAdders? "yes": "no" );
    Abc_Print( -2, "\t-f    : toggle showing only full-adders with \"-a\" [default = %s]\n", fFadds? "yes": "no" );
    Abc_Print( -2, "\t-p    : toggle showing the critical path of a LUT mapping [default = %s]\n", fPath? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}